

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O1

Vec_Ptr_t * Bac_NtkTransformToPtrInputs(Bac_Ntk_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = (p->vInputs).nSize;
  if ((long)iVar6 < 0) {
    __assert_fail("nCap >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
  }
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar6 << 3);
  }
  pVVar3->pArray = ppvVar4;
  if (0 < (p->vInputs).nSize) {
    lVar7 = 0;
    do {
      pcVar5 = Bac_ObjNameStr(p,(p->vInputs).pArray[lVar7]);
      uVar1 = pVVar3->nSize;
      uVar2 = pVVar3->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar2 * 2;
          if (iVar6 <= (int)uVar2) goto LAB_00394d23;
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
          }
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = iVar6;
      }
LAB_00394d23:
      pVVar3->nSize = uVar1 + 1;
      pVVar3->pArray[(int)uVar1] = pcVar5;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vInputs).nSize);
  }
  if (pVVar3->nSize != pVVar3->nCap) {
    __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtrInputs( Bac_Ntk_t * p )
{
    int i, iTerm;
    Vec_Ptr_t * vSigs = Vec_PtrAllocExact( Bac_NtkPiNum(p) );
    Bac_NtkForEachPi( p, iTerm, i )
        Vec_PtrPush( vSigs, Bac_ObjNameStr(p, iTerm) );
    assert( Ptr_CheckArray(vSigs) );
    return vSigs;
}